

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchIf<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  
  __s1 = (this->currentType).text;
  if (__s1 == expected.text) {
    bVar2 = true;
  }
  else if (expected.text == (char *)0x0 || __s1 == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp(__s1,expected.text);
    bVar2 = iVar1 == 0;
  }
  if (bVar2 != false) {
    skip(this);
  }
  return bVar2;
}

Assistant:

bool matchIf (Type expected)                                { if (matches (expected)) { skip(); return true; } return false; }